

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndexManager.cpp
# Opt level: O3

void __thiscall IndexManager::IndexManager(IndexManager *this)

{
  _Rb_tree_header *p_Var1;
  
  (this->Direction)._M_dataplus._M_p = (pointer)&(this->Direction).field_2;
  (this->Direction)._M_string_length = 0;
  (this->Direction).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->BpTrees_I)._M_t._M_impl.super__Rb_tree_header;
  (this->BpTrees_I)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->BpTrees_I)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->BpTrees_I)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->BpTrees_I)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->BpTrees_I)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->BpTrees_F)._M_t._M_impl.super__Rb_tree_header;
  (this->BpTrees_F)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->BpTrees_F)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->BpTrees_F)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->BpTrees_F)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->BpTrees_F)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->BpTrees_S)._M_t._M_impl.super__Rb_tree_header;
  (this->BpTrees_S)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->BpTrees_S)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->BpTrees_S)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->BpTrees_S)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->BpTrees_S)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::string::_M_replace((ulong)this,0,(char *)0x0,0x149820);
  return;
}

Assistant:

IndexManager::IndexManager(){
	this->Direction = "file/index/";
}